

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneratorInfoBase.hpp
# Opt level: O1

void __thiscall
GeneratorInfoBase::GeneratorInfoBase
          (GeneratorInfoBase *this,QAM *finalam,int deriv,OptionMap *options)

{
  pointer pcVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  this->_vptr_GeneratorInfoBase = (_func_int **)&PTR__GeneratorInfoBase_0015abb0;
  iVar2 = (finalam->qam)._M_elems[1];
  iVar3 = (finalam->qam)._M_elems[2];
  iVar4 = (finalam->qam)._M_elems[3];
  (this->finalam_).qam._M_elems[0] = (finalam->qam)._M_elems[0];
  (this->finalam_).qam._M_elems[1] = iVar2;
  (this->finalam_).qam._M_elems[2] = iVar3;
  (this->finalam_).qam._M_elems[3] = iVar4;
  (this->finalam_).tag._M_dataplus._M_p = (pointer)&(this->finalam_).tag.field_2;
  pcVar1 = (finalam->tag)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->finalam_).tag,pcVar1,pcVar1 + (finalam->tag)._M_string_length);
  this->deriv_ = deriv;
  std::
  _Rb_tree<Option,_std::pair<const_Option,_int>,_std::_Select1st<std::pair<const_Option,_int>_>,_std::less<Option>,_std::allocator<std::pair<const_Option,_int>_>_>
  ::_Rb_tree(&(this->options_)._M_t,&options->_M_t);
  return;
}

Assistant:

GeneratorInfoBase(QAM finalam, int deriv, const OptionMap & options)
        : finalam_(finalam), deriv_(deriv), options_(options) { }